

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * __thiscall
Corrade::Utility::String::Implementation::stripPrefix
          (string *__return_storage_ptr__,Implementation *this,string *string,
          ArrayView<const_char> prefix)

{
  ArrayView<const_char> prefix_00;
  bool bVar1;
  char *data;
  size_t size;
  ostream *output;
  Flags local_71;
  Error local_70;
  string *local_48;
  char *local_40;
  ArrayView<const_char> local_38;
  Implementation *local_28;
  string *string_local;
  ArrayView<const_char> prefix_local;
  
  prefix_local._data = prefix._data;
  local_28 = this;
  string_local = string;
  prefix_local._size = (size_t)__return_storage_ptr__;
  data = (char *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  Containers::ArrayView<const_char>::ArrayView(&local_38,data,size);
  local_48 = string_local;
  local_40 = prefix_local._data;
  prefix_00._size = (size_t)prefix_local._data;
  prefix_00._data = (char *)string_local;
  bVar1 = beginsWith(local_38,prefix_00);
  if (!bVar1) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_71);
    Error::Error(&local_70,output,local_71);
    Debug::operator<<(&local_70.super_Debug,
                      "Utility::String::stripPrefix(): string doesn\'t begin with given prefix");
    Error::~Error(&local_70);
    abort();
  }
  Containers::ArrayView<const_char>::size((ArrayView<const_char> *)&string_local);
  std::__cxx11::string::erase((ulong)this,0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string stripPrefix(std::string string, const Containers::ArrayView<const char> prefix) {
    CORRADE_ASSERT(beginsWith({string.data(), string.size()}, prefix),
        "Utility::String::stripPrefix(): string doesn't begin with given prefix", {});
    string.erase(0, prefix.size());
    return string;
}